

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libc_wrappers.c
# Opt level: O0

int slong_to_str(long num,char *str,int strlen)

{
  int iVar1;
  int result;
  int strlen_local;
  char *str_local;
  long num_local;
  
  if (num < 0) {
    iVar1 = ulong_to_str(-num,str + 1,strlen + -1);
    if (iVar1 == -1) {
      num_local._4_4_ = -1;
    }
    else {
      *str = '-';
      num_local._4_4_ = iVar1 + 1;
    }
  }
  else {
    num_local._4_4_ = ulong_to_str(num,str,strlen);
  }
  return num_local._4_4_;
}

Assistant:

static int slong_to_str(signed long num, char *str, int strlen) {
  int result = 0;
  if (num >= 0) return ulong_to_str((unsigned long)num, str, strlen);

  result = ulong_to_str((unsigned long)(num * -1), str + 1, strlen - 1);
  if (result == -1) return -1;  // GCOVR_EXCL_LINE
  str[0] = '-';
  return result + 1;
}